

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_DoublyLinkedList_Test::TestBody(SCCTest_DoublyLinkedList_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_00;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_150;
  AssertHelper local_128;
  Message local_120;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_115;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_114;
  undefined1 local_113;
  allocator<unsigned_int> local_112;
  less<unsigned_int> local_111;
  uint local_110 [4];
  iterator local_100;
  size_type local_f8;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_f0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_DoublyLinkedList_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,4);
  Graph::addEdge((Graph *)local_28,0,1);
  Graph::addEdge((Graph *)local_28,1,0);
  Graph::addEdge((Graph *)local_28,2,3);
  Graph::addEdge((Graph *)local_28,3,2);
  Graph::addEdge((Graph *)local_28,1,2);
  Graph::addEdge((Graph *)local_28,2,1);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_113 = 1;
  local_110[0] = 0;
  local_110[1] = 1;
  local_110[2] = 2;
  local_110[3] = 3;
  local_100 = local_110;
  local_f8 = 4;
  local_f0 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_112);
  __l._M_len = local_f8;
  __l._M_array = local_100;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_111,&local_112);
  local_113 = 0;
  local_b8 = &local_e8;
  local_b0 = 1;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_115);
  __l_00._M_len = local_b0;
  __l_00._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_00,&local_114,&local_115);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet{{0, 1, 2, 3}})",&local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_115);
  local_150 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_150 = local_150 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_150);
  } while (local_150 != &local_e8);
  std::allocator<unsigned_int>::~allocator(&local_112);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x10a,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, DoublyLinkedList) {
  // 0 <-> 1 <-> 2 <-> 3
  Graph graph(4);
  graph.addEdge(0, 1);
  graph.addEdge(1, 0);
  graph.addEdge(2, 3);
  graph.addEdge(3, 2);
  graph.addEdge(1, 2);
  // New from previous, combines SCCs.
  graph.addEdge(2, 1);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1, 2, 3}}));
}